

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

Function<std::tuple<int,_int>_(),_false> * __thiscall
crampl::detail::Function<std::tuple<int,int>(),false>::operator=
          (Function<std::tuple<int,int>(),false> *this,
          Function<std::tuple<int,_int>_(),_false> *_rhs)

{
  (**(code **)(this + 0x10))(this,0);
  Function<std::tuple<int,_int>_(),_false>::init_from
            ((Function<std::tuple<int,_int>_(),_false> *)this,_rhs);
  return (Function<std::tuple<int,_int>_(),_false> *)this;
}

Assistant:

Function& operator=(T&& _rhs) noexcept {
		destroy();
		init_from(std::forward<T>(_rhs));
		return *this;
	}